

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::Shape
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,
          TPZFMatrix<double> *dphi)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long *in_RCX;
  long *in_RDX;
  long *in_RDI;
  int curldim;
  int dim;
  int nShape;
  int ic;
  TPZManVector<int,_19> conorders;
  int64_t nConnects;
  int i;
  TPZGeoEl *ref;
  TPZManVector<long,_8> ids;
  TPZShapeData data;
  undefined4 in_stack_ffffffffffffc590;
  TPZCompEl *in_stack_ffffffffffffc598;
  undefined4 in_stack_ffffffffffffc5a0;
  undefined4 in_stack_ffffffffffffc5a4;
  long *in_stack_ffffffffffffc5b0;
  undefined4 in_stack_ffffffffffffc5b8;
  int in_stack_ffffffffffffc5bc;
  TPZManVector<int,_19> *in_stack_ffffffffffffc5c0;
  int local_3a18;
  TPZFMatrix<double> *in_stack_ffffffffffffc5f8;
  TPZShapeData *in_stack_ffffffffffffc600;
  TPZShapeData *in_stack_ffffffffffffc608;
  TPZVec<double> *in_stack_ffffffffffffc610;
  int local_3994;
  TPZVec<long> local_3970 [6];
  TPZShapeData *in_stack_ffffffffffffc750;
  TPZVec<int> *in_stack_ffffffffffffc758;
  TPZVec<long> *in_stack_ffffffffffffc760;
  
  TPZShapeData::TPZShapeData(in_stack_ffffffffffffc600);
  TPZManVector<long,_8>::TPZManVector
            ((TPZManVector<long,_8> *)in_stack_ffffffffffffc5c0,
             CONCAT44(in_stack_ffffffffffffc5bc,in_stack_ffffffffffffc5b8),in_stack_ffffffffffffc5b0
            );
  TPZCompEl::Reference(in_stack_ffffffffffffc598);
  for (local_3994 = 0; local_3994 < 8; local_3994 = local_3994 + 1) {
    in_stack_ffffffffffffc5c0 =
         (TPZManVector<int,_19> *)
         TPZGeoEl::NodePtr((TPZGeoEl *)CONCAT44(in_stack_ffffffffffffc5a4,in_stack_ffffffffffffc5a0)
                           ,(int)((ulong)in_stack_ffffffffffffc598 >> 0x20));
    in_stack_ffffffffffffc5bc = TPZGeoNode::Id((TPZGeoNode *)in_stack_ffffffffffffc5c0);
    lVar3 = (long)in_stack_ffffffffffffc5bc;
    in_stack_ffffffffffffc5b0 = TPZVec<long>::operator[](local_3970,(long)local_3994);
    *in_stack_ffffffffffffc5b0 = lVar3;
  }
  TPZManVector<int,_19>::TPZManVector
            (in_stack_ffffffffffffc5c0,CONCAT44(in_stack_ffffffffffffc5bc,in_stack_ffffffffffffc5b8)
             ,(int *)in_stack_ffffffffffffc5b0);
  for (local_3a18 = 0; local_3a18 < 0x13; local_3a18 = local_3a18 + 1) {
    iVar1 = (**(code **)(*in_RDI + 0x3c0))(in_RDI,local_3a18);
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&stack0xffffffffffffc5f0,(long)local_3a18);
    *piVar4 = iVar1;
  }
  TPZShapeHCurl<pzshape::TPZShapeCube>::Initialize
            (in_stack_ffffffffffffc760,in_stack_ffffffffffffc758,in_stack_ffffffffffffc750);
  iVar2 = (**(code **)(*in_RDI + 600))();
  iVar1 = iVar2;
  (**(code **)(*in_RDX + 0x70))(in_RDX,3,(long)iVar2);
  (**(code **)(*in_RCX + 0x70))(in_RCX,3,(long)iVar2);
  TPZShapeHCurl<pzshape::TPZShapeCube>::Shape
            (in_stack_ffffffffffffc610,in_stack_ffffffffffffc608,
             (TPZFMatrix<double> *)in_stack_ffffffffffffc600,in_stack_ffffffffffffc5f8);
  TPZManVector<int,_19>::~TPZManVector
            ((TPZManVector<int,_19> *)CONCAT44(iVar1,in_stack_ffffffffffffc590));
  TPZManVector<long,_8>::~TPZManVector
            ((TPZManVector<long,_8> *)CONCAT44(iVar1,in_stack_ffffffffffffc590));
  TPZShapeData::~TPZShapeData((TPZShapeData *)CONCAT44(iVar1,in_stack_ffffffffffffc590));
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
    //this method is not really useful right now
    TPZShapeData data;

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes,0);
    TPZGeoEl *ref = this->Reference();
    for(auto i=0; i<TSHAPE::NCornerNodes; i++) {
        ids[i] = ref->NodePtr(i)->Id();
    }
    
    constexpr auto nConnects{TSHAPE::NSides-TSHAPE::NCornerNodes};
    TPZManVector<int, nConnects> conorders(nConnects,0);

    for(int ic = 0; ic < nConnects; ic++){
        conorders[ic] = this->ConnectOrder(ic);
    }

    TPZShapeHCurl<TSHAPE>::Initialize(ids,conorders,data);
    const auto nShape = this->NShapeF();

    constexpr int dim = TSHAPE::Dimension;

    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    phi.Redim(dim,nShape);
    dphi.Redim(curldim, nShape);
    
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi, dphi);
}